

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_glsl_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t length)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  bool bVar1;
  uint32_t uVar2;
  BaseType expected_result_type;
  BaseType input_type;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type *this_01;
  SPIRType *pSVar5;
  runtime_error *prVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char *pcVar10;
  uint32_t i;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  uint32_t id_local;
  string op0;
  string op1;
  uint32_t eop_local;
  string local_1c0;
  string local_1a0;
  __node_gen_type __node_gen;
  __hashtable_alloc local_170 [320];
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,length);
  uVar7 = 0x81;
  if ((this->options).es != false) {
    uVar7 = 299;
  }
  id_local = id;
  eop_local = eop;
  if ((((this->options).version <= uVar7) && (eop - 0x26 < 0x26)) &&
     ((0x2000000049U >> ((ulong)(eop - 0x26) & 0x3f) & 1) != 0)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    __node_gen._M_h = local_170;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__node_gen,"Unsigned integers are not supported on legacy GLSL targets.",
               "");
    ::std::runtime_error::runtime_error(prVar6,(string *)&__node_gen);
    *(undefined ***)prVar6 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar2 = get_integer_width_for_glsl_instruction(this,eop,args,length);
  expected_result_type = to_signed_basetype(uVar2);
  input_type = to_unsigned_basetype(uVar2);
  switch(eop) {
  case 1:
    uVar2 = *args;
    pcVar10 = "round";
    break;
  case 2:
    uVar7 = 0x82;
    if ((this->options).es != false) {
      uVar7 = 300;
    }
    if ((this->options).version < uVar7) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      __node_gen._M_h = local_170;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__node_gen,"roundEven supported only in ESSL 300 and GLSL 130 and up.",
                 "");
      ::std::runtime_error::runtime_error(prVar6,(string *)&__node_gen);
      *(undefined ***)prVar6 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar2 = *args;
    pcVar10 = "roundEven";
    break;
  case 3:
    uVar2 = *args;
    pcVar10 = "trunc";
    break;
  case 4:
    uVar2 = *args;
    pcVar10 = "abs";
    break;
  case 5:
    uVar2 = *args;
    pcVar10 = "abs";
    input_type = expected_result_type;
    goto LAB_001cc869;
  case 6:
    uVar2 = *args;
    pcVar10 = "sign";
    break;
  case 7:
    uVar2 = *args;
    pcVar10 = "sign";
    input_type = expected_result_type;
    goto LAB_001cc869;
  case 8:
    uVar2 = *args;
    pcVar10 = "floor";
    break;
  case 9:
    uVar2 = *args;
    pcVar10 = "ceil";
    break;
  case 10:
    uVar2 = *args;
    pcVar10 = "fract";
    break;
  case 0xb:
    uVar2 = *args;
    pcVar10 = "radians";
    break;
  case 0xc:
    uVar2 = *args;
    pcVar10 = "degrees";
    break;
  case 0xd:
    uVar2 = *args;
    pcVar10 = "sin";
    break;
  case 0xe:
    uVar2 = *args;
    pcVar10 = "cos";
    break;
  case 0xf:
    uVar2 = *args;
    pcVar10 = "tan";
    break;
  case 0x10:
    uVar2 = *args;
    pcVar10 = "asin";
    break;
  case 0x11:
    uVar2 = *args;
    pcVar10 = "acos";
    break;
  case 0x12:
    uVar2 = *args;
    pcVar10 = "atan";
    break;
  case 0x13:
    uVar2 = *args;
    pcVar10 = "sinh";
    break;
  case 0x14:
    uVar2 = *args;
    pcVar10 = "cosh";
    break;
  case 0x15:
    uVar2 = *args;
    pcVar10 = "tanh";
    break;
  case 0x16:
    uVar2 = *args;
    pcVar10 = "asinh";
    break;
  case 0x17:
    uVar2 = *args;
    pcVar10 = "acosh";
    break;
  case 0x18:
    uVar2 = *args;
    pcVar10 = "atanh";
    break;
  case 0x19:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "atan";
    goto LAB_001cc716;
  case 0x1a:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "pow";
    goto LAB_001cc716;
  case 0x1b:
    uVar2 = *args;
    pcVar10 = "exp";
    break;
  case 0x1c:
    uVar2 = *args;
    pcVar10 = "log";
    break;
  case 0x1d:
    uVar2 = *args;
    pcVar10 = "exp2";
    break;
  case 0x1e:
    uVar2 = *args;
    pcVar10 = "log2";
    break;
  case 0x1f:
    uVar2 = *args;
    pcVar10 = "sqrt";
    break;
  case 0x20:
    uVar2 = *args;
    pcVar10 = "inversesqrt";
    break;
  case 0x21:
    uVar2 = *args;
    pcVar10 = "determinant";
    break;
  case 0x22:
    uVar2 = *args;
    pcVar10 = "inverse";
    break;
  case 0x23:
    register_call_out_argument(this,args[1]);
    __node_gen._M_h = (__hashtable_alloc *)&(this->super_Compiler).forced_temporaries;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)__node_gen._M_h,&id_local);
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "modf";
    goto LAB_001cc2fe;
  case 0x24:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        result_type);
    emit_uninitialized_temporary_expression(this,result_type,id);
    to_expression_abi_cxx11_((string *)&__node_gen,this,id,true);
    to_member_name_abi_cxx11_(&op0,this,pSVar5,0);
    to_expression_abi_cxx11_(&op1,this,*args,true);
    to_expression_abi_cxx11_(&local_1c0,this,id_local,true);
    to_member_name_abi_cxx11_(&local_1a0,this,pSVar5,1);
    statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[6],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__node_gen
               ,(char (*) [2])0x2dfc12,&op0,(char (*) [4])0x2f38c7,(char (*) [6])"modf(",&op1,
               (char (*) [3])0x2f06f8,&local_1c0,(char (*) [2])0x2dfc12,&local_1a0,
               (char (*) [3])0x2d9bdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op1._M_dataplus._M_p != &op1.field_2) {
      operator_delete(op1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p) != &op0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p));
    }
    if (__node_gen._M_h == local_170) {
      return;
    }
    goto LAB_001ccbfd;
  case 0x25:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "min";
    goto LAB_001cc716;
  case 0x26:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "min";
    goto LAB_001cc7a9;
  case 0x27:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "min";
    input_type = expected_result_type;
    goto LAB_001cc7a9;
  case 0x28:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "max";
    goto LAB_001cc716;
  case 0x29:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "max";
    goto LAB_001cc7a9;
  case 0x2a:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "max";
    input_type = expected_result_type;
LAB_001cc7a9:
    emit_binary_func_op_cast(this,result_type,id,uVar2,uVar8,pcVar10,input_type,false);
    return;
  case 0x2b:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    pcVar10 = "clamp";
    goto LAB_001cca17;
  case 0x2c:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    goto LAB_001cc350;
  case 0x2d:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    input_type = expected_result_type;
LAB_001cc350:
    emit_trinary_func_op_cast(this,result_type,id,uVar2,uVar8,uVar9,"clamp",input_type);
    return;
  case 0x2e:
  case 0x2f:
    emit_mix_op(this,result_type,id,*args,args[1],args[2]);
    return;
  case 0x30:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "step";
    goto LAB_001cc716;
  case 0x31:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    pcVar10 = "smoothstep";
    goto LAB_001cca17;
  case 0x32:
    uVar7 = 400;
    if ((this->options).es != false) {
      uVar7 = 0x140;
    }
    if (uVar7 <= (this->options).version) {
      uVar2 = *args;
      uVar8 = args[1];
      uVar9 = args[2];
      pcVar10 = "fma";
      goto LAB_001cca17;
    }
    to_enclosed_expression_abi_cxx11_(&op0,this,*args,true);
    to_enclosed_expression_abi_cxx11_(&op1,this,args[1],true);
    to_enclosed_expression_abi_cxx11_(&local_1c0,this,args[2],true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
              ((string *)&__node_gen,(spirv_cross *)&op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3a0b,
               (char (*) [4])&op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3a35,
               (char (*) [4])&local_1c0,in_stack_fffffffffffffde8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op1._M_dataplus._M_p != &op1.field_2) {
      operator_delete(op1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p) != &op0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p));
    }
    uVar2 = id_local;
    bVar1 = should_forward(this,*args);
    if ((bVar1) && (bVar1 = should_forward(this,args[1]), bVar1)) {
      bVar1 = should_forward(this,args[2]);
    }
    else {
      bVar1 = false;
    }
    emit_op(this,result_type,uVar2,(string *)&__node_gen,bVar1,false);
    lVar11 = 0;
    do {
      Compiler::inherit_expression_dependencies(&this->super_Compiler,id_local,args[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if (__node_gen._M_h == local_170) {
      return;
    }
    goto LAB_001ccbfd;
  case 0x33:
    register_call_out_argument(this,args[1]);
    __node_gen._M_h = (__hashtable_alloc *)&(this->super_Compiler).forced_temporaries;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)__node_gen._M_h,&id_local);
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "frexp";
LAB_001cc2fe:
    emit_binary_func_op(this,result_type,id_local,uVar2,uVar8,pcVar10);
    return;
  case 0x34:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        result_type);
    emit_uninitialized_temporary_expression(this,result_type,id);
    to_expression_abi_cxx11_((string *)&__node_gen,this,id,true);
    to_member_name_abi_cxx11_(&op0,this,pSVar5,0);
    to_expression_abi_cxx11_(&op1,this,*args,true);
    to_expression_abi_cxx11_(&local_1c0,this,id_local,true);
    to_member_name_abi_cxx11_(&local_1a0,this,pSVar5,1);
    statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__node_gen
               ,(char (*) [2])0x2dfc12,&op0,(char (*) [4])0x2f38c7,(char (*) [7])"frexp(",&op1,
               (char (*) [3])0x2f06f8,&local_1c0,(char (*) [2])0x2dfc12,&local_1a0,
               (char (*) [3])0x2d9bdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op1._M_dataplus._M_p != &op1.field_2) {
      operator_delete(op1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p) != &op0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p));
    }
    if (__node_gen._M_h == local_170) {
      return;
    }
    goto LAB_001ccbfd;
  case 0x35:
    bVar1 = should_forward(this,*args);
    if (bVar1) {
      bVar1 = should_forward(this,args[1]);
    }
    else {
      bVar1 = false;
    }
    to_unpacked_expression_abi_cxx11_(&op0,this,*args,true);
    to_unpacked_expression_abi_cxx11_(&op1,this,args[1],true);
    pSVar5 = Compiler::expression_type(&this->super_Compiler,args[1]);
    if (*(int *)&(pSVar5->super_IVariant).field_0xc != 7) {
      SPIRType::SPIRType((SPIRType *)&__node_gen,pSVar5);
      type_to_glsl_constructor_abi_cxx11_(&local_1a0,this,(SPIRType *)&__node_gen);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1c0,(spirv_cross *)&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
                 (char (*) [2])&op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&op1,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      SPIRType::~SPIRType((SPIRType *)&__node_gen);
    }
    join<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              ((string *)&__node_gen,(spirv_cross *)"ldexp(",(char (*) [7])&op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f06f8,
               (char (*) [3])&op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,
               (char (*) [2])in_stack_fffffffffffffde8);
    emit_op(this,result_type,id_local,(string *)&__node_gen,bVar1,false);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,id_local,*args);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,id_local,args[1]);
    if (__node_gen._M_h != local_170) {
      operator_delete(__node_gen._M_h);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op1._M_dataplus._M_p != &op1.field_2) {
      operator_delete(op1._M_dataplus._M_p);
    }
    __node_gen._M_h =
         (__hashtable_alloc *)CONCAT44(op0._M_dataplus._M_p._4_4_,(mapped_type)op0._M_dataplus._M_p)
    ;
    if (__node_gen._M_h == (__hashtable_alloc *)&op0.field_2) {
      return;
    }
LAB_001ccbfd:
    operator_delete(__node_gen._M_h);
    return;
  case 0x36:
    uVar2 = *args;
    pcVar10 = "packSnorm4x8";
    break;
  case 0x37:
    uVar2 = *args;
    pcVar10 = "packUnorm4x8";
    break;
  case 0x38:
    uVar2 = *args;
    pcVar10 = "packSnorm2x16";
    break;
  case 0x39:
    uVar2 = *args;
    pcVar10 = "packUnorm2x16";
    break;
  case 0x3a:
    uVar2 = *args;
    pcVar10 = "packHalf2x16";
    break;
  case 0x3b:
    uVar2 = *args;
    pcVar10 = "packDouble2x32";
    break;
  case 0x3c:
    uVar2 = *args;
    pcVar10 = "unpackSnorm2x16";
    break;
  case 0x3d:
    uVar2 = *args;
    pcVar10 = "unpackUnorm2x16";
    break;
  case 0x3e:
    uVar2 = *args;
    pcVar10 = "unpackHalf2x16";
    break;
  case 0x3f:
    uVar2 = *args;
    pcVar10 = "unpackSnorm4x8";
    break;
  case 0x40:
    uVar2 = *args;
    pcVar10 = "unpackUnorm4x8";
    break;
  case 0x41:
    uVar2 = *args;
    pcVar10 = "unpackDouble2x32";
    break;
  case 0x42:
    uVar2 = *args;
    pcVar10 = "length";
    break;
  case 0x43:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "distance";
    goto LAB_001cc716;
  case 0x44:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "cross";
    goto LAB_001cc716;
  case 0x45:
    uVar2 = *args;
    pcVar10 = "normalize";
    break;
  case 0x46:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    pcVar10 = "faceforward";
    goto LAB_001cca17;
  case 0x47:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "reflect";
    goto LAB_001cc716;
  case 0x48:
    uVar2 = *args;
    uVar8 = args[1];
    uVar9 = args[2];
    pcVar10 = "refract";
LAB_001cca17:
    emit_trinary_func_op(this,result_type,id,uVar2,uVar8,uVar9,pcVar10);
    return;
  case 0x49:
    uVar2 = *args;
    pSVar5 = Compiler::expression_type(&this->super_Compiler,uVar2);
    pcVar10 = "findLSB";
    input_type = *(BaseType *)&(pSVar5->super_IVariant).field_0xc;
    goto LAB_001cc869;
  case 0x4a:
    uVar2 = *args;
    pcVar10 = "findMSB";
    input_type = expected_result_type;
    goto LAB_001cc869;
  case 0x4b:
    uVar2 = *args;
    pcVar10 = "findMSB";
LAB_001cc869:
    emit_unary_func_op_cast(this,result_type,id,uVar2,pcVar10,input_type,expected_result_type);
    return;
  case 0x4c:
    uVar2 = *args;
    pcVar10 = "interpolateAtCentroid";
    break;
  case 0x4d:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "interpolateAtSample";
    goto LAB_001cc716;
  case 0x4e:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar10 = "interpolateAtOffset";
LAB_001cc716:
    emit_binary_func_op(this,result_type,id,uVar2,uVar8,pcVar10);
    return;
  case 0x4f:
  case 0x50:
    emit_nminmax_op(this,result_type,id,*args,args[1],eop);
    return;
  case 0x51:
    __node_gen._M_h = (__hashtable_alloc *)(CONCAT44(__node_gen._M_h._4_4_,id) | 0x80000000);
    pmVar3 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->extra_sub_expressions,(key_type *)&__node_gen);
    if (*pmVar3 == 0) {
      uVar2 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
      *pmVar3 = uVar2;
    }
    this_00 = &(this->super_Compiler).ir.meta;
    __node_gen._M_h._0_4_ = id_local;
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)&__node_gen);
    op0._M_dataplus._M_p._0_4_ = *pmVar3;
    this_01 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)&op0);
    Meta::operator=(this_01,pmVar4);
    emit_nminmax_op(this,result_type,*pmVar3,*args,args[1],GLSLstd450NMax);
    emit_nminmax_op(this,result_type,id_local,*pmVar3,args[2],GLSLstd450NMin);
    return;
  default:
    statement<char_const(&)[26],unsigned_int&>
              (this,(char (*) [26])"// unimplemented GLSL op ",&eop_local);
    return;
  }
  emit_unary_func_op(this,result_type,id,uVar2,pcVar10);
  return;
}

Assistant:

void CompilerGLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t length)
{
	auto op = static_cast<GLSLstd450>(eop);

	if (is_legacy() && is_unsigned_glsl_opcode(op))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy GLSL targets.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, length);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	// FP fiddling
	case GLSLstd450Round:
		emit_unary_func_op(result_type, id, args[0], "round");
		break;

	case GLSLstd450RoundEven:
		if ((options.es && options.version >= 300) || (!options.es && options.version >= 130))
			emit_unary_func_op(result_type, id, args[0], "roundEven");
		else
			SPIRV_CROSS_THROW("roundEven supported only in ESSL 300 and GLSL 130 and up.");
		break;

	case GLSLstd450Trunc:
		emit_unary_func_op(result_type, id, args[0], "trunc");
		break;
	case GLSLstd450SAbs:
		emit_unary_func_op_cast(result_type, id, args[0], "abs", int_type, int_type);
		break;
	case GLSLstd450FAbs:
		emit_unary_func_op(result_type, id, args[0], "abs");
		break;
	case GLSLstd450SSign:
		emit_unary_func_op_cast(result_type, id, args[0], "sign", int_type, int_type);
		break;
	case GLSLstd450FSign:
		emit_unary_func_op(result_type, id, args[0], "sign");
		break;
	case GLSLstd450Floor:
		emit_unary_func_op(result_type, id, args[0], "floor");
		break;
	case GLSLstd450Ceil:
		emit_unary_func_op(result_type, id, args[0], "ceil");
		break;
	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "fract");
		break;
	case GLSLstd450Radians:
		emit_unary_func_op(result_type, id, args[0], "radians");
		break;
	case GLSLstd450Degrees:
		emit_unary_func_op(result_type, id, args[0], "degrees");
		break;
	case GLSLstd450Fma:
		if ((!options.es && options.version < 400) || (options.es && options.version < 320))
		{
			auto expr = join(to_enclosed_expression(args[0]), " * ", to_enclosed_expression(args[1]), " + ",
			                 to_enclosed_expression(args[2]));

			emit_op(result_type, id, expr,
			        should_forward(args[0]) && should_forward(args[1]) && should_forward(args[2]));
			for (uint32_t i = 0; i < 3; i++)
				inherit_expression_dependencies(id, args[i]);
		}
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fma");
		break;
	case GLSLstd450Modf:
		register_call_out_argument(args[1]);
		forced_temporaries.insert(id);
		emit_binary_func_op(result_type, id, args[0], args[1], "modf");
		break;

	case GLSLstd450ModfStruct:
	{
		auto &type = get<SPIRType>(result_type);
		emit_uninitialized_temporary_expression(result_type, id);
		statement(to_expression(id), ".", to_member_name(type, 0), " = ", "modf(", to_expression(args[0]), ", ",
		          to_expression(id), ".", to_member_name(type, 1), ");");
		break;
	}

	// Minmax
	case GLSLstd450UMin:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "min", uint_type, false);
		break;

	case GLSLstd450SMin:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "min", int_type, false);
		break;

	case GLSLstd450FMin:
		emit_binary_func_op(result_type, id, args[0], args[1], "min");
		break;

	case GLSLstd450FMax:
		emit_binary_func_op(result_type, id, args[0], args[1], "max");
		break;

	case GLSLstd450UMax:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "max", uint_type, false);
		break;

	case GLSLstd450SMax:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "max", int_type, false);
		break;

	case GLSLstd450FClamp:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		break;

	case GLSLstd450UClamp:
		emit_trinary_func_op_cast(result_type, id, args[0], args[1], args[2], "clamp", uint_type);
		break;

	case GLSLstd450SClamp:
		emit_trinary_func_op_cast(result_type, id, args[0], args[1], args[2], "clamp", int_type);
		break;

	// Trig
	case GLSLstd450Sin:
		emit_unary_func_op(result_type, id, args[0], "sin");
		break;
	case GLSLstd450Cos:
		emit_unary_func_op(result_type, id, args[0], "cos");
		break;
	case GLSLstd450Tan:
		emit_unary_func_op(result_type, id, args[0], "tan");
		break;
	case GLSLstd450Asin:
		emit_unary_func_op(result_type, id, args[0], "asin");
		break;
	case GLSLstd450Acos:
		emit_unary_func_op(result_type, id, args[0], "acos");
		break;
	case GLSLstd450Atan:
		emit_unary_func_op(result_type, id, args[0], "atan");
		break;
	case GLSLstd450Sinh:
		emit_unary_func_op(result_type, id, args[0], "sinh");
		break;
	case GLSLstd450Cosh:
		emit_unary_func_op(result_type, id, args[0], "cosh");
		break;
	case GLSLstd450Tanh:
		emit_unary_func_op(result_type, id, args[0], "tanh");
		break;
	case GLSLstd450Asinh:
		emit_unary_func_op(result_type, id, args[0], "asinh");
		break;
	case GLSLstd450Acosh:
		emit_unary_func_op(result_type, id, args[0], "acosh");
		break;
	case GLSLstd450Atanh:
		emit_unary_func_op(result_type, id, args[0], "atanh");
		break;
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan");
		break;

	// Exponentials
	case GLSLstd450Pow:
		emit_binary_func_op(result_type, id, args[0], args[1], "pow");
		break;
	case GLSLstd450Exp:
		emit_unary_func_op(result_type, id, args[0], "exp");
		break;
	case GLSLstd450Log:
		emit_unary_func_op(result_type, id, args[0], "log");
		break;
	case GLSLstd450Exp2:
		emit_unary_func_op(result_type, id, args[0], "exp2");
		break;
	case GLSLstd450Log2:
		emit_unary_func_op(result_type, id, args[0], "log2");
		break;
	case GLSLstd450Sqrt:
		emit_unary_func_op(result_type, id, args[0], "sqrt");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "inversesqrt");
		break;

	// Matrix math
	case GLSLstd450Determinant:
		emit_unary_func_op(result_type, id, args[0], "determinant");
		break;
	case GLSLstd450MatrixInverse:
		emit_unary_func_op(result_type, id, args[0], "inverse");
		break;

	// Lerping
	case GLSLstd450FMix:
	case GLSLstd450IMix:
	{
		emit_mix_op(result_type, id, args[0], args[1], args[2]);
		break;
	}
	case GLSLstd450Step:
		emit_binary_func_op(result_type, id, args[0], args[1], "step");
		break;
	case GLSLstd450SmoothStep:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "smoothstep");
		break;

	// Packing
	case GLSLstd450Frexp:
		register_call_out_argument(args[1]);
		forced_temporaries.insert(id);
		emit_binary_func_op(result_type, id, args[0], args[1], "frexp");
		break;

	case GLSLstd450FrexpStruct:
	{
		auto &type = get<SPIRType>(result_type);
		emit_uninitialized_temporary_expression(result_type, id);
		statement(to_expression(id), ".", to_member_name(type, 0), " = ", "frexp(", to_expression(args[0]), ", ",
		          to_expression(id), ".", to_member_name(type, 1), ");");
		break;
	}

	case GLSLstd450Ldexp:
	{
		bool forward = should_forward(args[0]) && should_forward(args[1]);

		auto op0 = to_unpacked_expression(args[0]);
		auto op1 = to_unpacked_expression(args[1]);
		auto &op1_type = expression_type(args[1]);
		if (op1_type.basetype != SPIRType::Int)
		{
			// Need a value cast here.
			auto target_type = op1_type;
			target_type.basetype = SPIRType::Int;
			op1 = join(type_to_glsl_constructor(target_type), "(", op1, ")");
		}

		auto expr = join("ldexp(", op0, ", ", op1, ")");

		emit_op(result_type, id, expr, forward);
		inherit_expression_dependencies(id, args[0]);
		inherit_expression_dependencies(id, args[1]);
		break;
	}

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "packSnorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "packUnorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "packSnorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "packUnorm2x16");
		break;
	case GLSLstd450PackHalf2x16:
		emit_unary_func_op(result_type, id, args[0], "packHalf2x16");
		break;
	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpackSnorm4x8");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpackUnorm4x8");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackSnorm2x16");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackUnorm2x16");
		break;
	case GLSLstd450UnpackHalf2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackHalf2x16");
		break;

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "packDouble2x32");
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unpackDouble2x32");
		break;

	// Vector math
	case GLSLstd450Length:
		emit_unary_func_op(result_type, id, args[0], "length");
		break;
	case GLSLstd450Distance:
		emit_binary_func_op(result_type, id, args[0], args[1], "distance");
		break;
	case GLSLstd450Cross:
		emit_binary_func_op(result_type, id, args[0], args[1], "cross");
		break;
	case GLSLstd450Normalize:
		emit_unary_func_op(result_type, id, args[0], "normalize");
		break;
	case GLSLstd450FaceForward:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "faceforward");
		break;
	case GLSLstd450Reflect:
		emit_binary_func_op(result_type, id, args[0], args[1], "reflect");
		break;
	case GLSLstd450Refract:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "refract");
		break;

	// Bit-fiddling
	case GLSLstd450FindILsb:
		// findLSB always returns int.
		emit_unary_func_op_cast(result_type, id, args[0], "findLSB", expression_type(args[0]).basetype, int_type);
		break;

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "findMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "findMSB", uint_type,
		                        int_type); // findMSB always returns int.
		break;

	// Multisampled varying
	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "interpolateAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "interpolateAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "interpolateAtOffset");
		break;

	case GLSLstd450NMin:
	case GLSLstd450NMax:
	{
		emit_nminmax_op(result_type, id, args[0], args[1], op);
		break;
	}

	case GLSLstd450NClamp:
	{
		// Make sure we have a unique ID here to avoid aliasing the extra sub-expressions between clamp and NMin sub-op.
		// IDs cannot exceed 24 bits, so we can make use of the higher bits for some unique flags.
		uint32_t &max_id = extra_sub_expressions[id | 0x80000000u];
		if (!max_id)
			max_id = ir.increase_bound_by(1);

		// Inherit precision qualifiers.
		ir.meta[max_id] = ir.meta[id];

		emit_nminmax_op(result_type, max_id, args[0], args[1], GLSLstd450NMax);
		emit_nminmax_op(result_type, id, max_id, args[2], GLSLstd450NMin);
		break;
	}

	default:
		statement("// unimplemented GLSL op ", eop);
		break;
	}
}